

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O1

int __thiscall Hypergraph::extendable(Hypergraph *this,edge *x,edge *y)

{
  uint uVar1;
  pointer puVar2;
  pointer pvVar3;
  uint uVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  rep rVar10;
  long lVar11;
  ulong uVar12;
  size_type sVar13;
  size_type sVar14;
  time_point tVar15;
  ulong uVar16;
  unsigned_long uVar17;
  pointer __x;
  pointer pdVar18;
  char cVar19;
  ulong uVar20;
  Hypergraph *pHVar21;
  ulong uVar22;
  string *__str;
  int iVar23;
  pointer pdVar24;
  uint uVar25;
  bool bVar26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  s;
  edge_vec t;
  edge intersection;
  edge e;
  string *__str_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> iteration_position;
  string *__str_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> x_index_to_s_index;
  int local_438;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_420;
  allocator_type local_401;
  edge *local_400;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_3f8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_3d8;
  string local_3b8;
  string local_398;
  undefined1 *local_378 [2];
  undefined1 local_368 [16];
  string local_358;
  string local_338;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  char *local_2d8;
  uint local_2d0;
  char local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  char *local_278;
  uint local_270;
  char local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [24];
  undefined1 **local_230;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  Table *local_208;
  undefined1 **local_200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  undefined1 local_1e0 [48];
  undefined1 local_1b0 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  undefined1 local_168 [48];
  undefined1 local_138 [48];
  undefined1 local_108 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  undefined1 local_a8 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((this->m_configuration).collect_oracle_statistics == true) {
    rVar10 = std::chrono::_V2::system_clock::now();
    (this->m_oracle_timestamp).__d.__r = rVar10;
  }
  puVar2 = (x->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(x->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  bVar26 = lVar11 != 0;
  if (lVar11 == 0) {
LAB_0012ffaa:
    if (!bVar26) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,y);
      bVar26 = is_hitting_set(this,(edge *)&local_3b8);
      bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_3b8);
      if (bVar6) {
        if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_3b8._M_dataplus._M_p);
        }
        bVar6 = (this->m_configuration).collect_oracle_statistics;
        if (bVar26) {
          if (bVar6 == false) {
            return 1;
          }
          tVar15.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          edge_to_string_abi_cxx11_(&local_3b8,x);
          edge_to_string_abi_cxx11_(&local_398,y);
          local_378[0] = local_368;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"3","");
          ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar15);
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
          local_318[0] = local_308;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
          local_2f8[0] = local_2e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"");
          local_2d8 = local_2c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
          local_2b8[0] = local_2a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
          local_298[0] = local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
          local_278 = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
          local_258[0] = local_248;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
          __l_00._M_len = 0xc;
          __l_00._M_array = &local_3b8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_60,__l_00,(allocator_type *)&local_3d8);
          Table::add_record(&this->m_oracle_stats,&local_60);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
          lVar11 = 0;
          do {
            if (local_248 + lVar11 != *(undefined1 **)((long)local_258 + lVar11)) {
              operator_delete(*(undefined1 **)((long)local_258 + lVar11));
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x180);
          return 1;
        }
        if (bVar6 == false) {
          return 0;
        }
        tVar15.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_(&local_3b8,x);
        edge_to_string_abi_cxx11_(&local_398,y);
        local_378[0] = local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"4","");
        ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar15);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
        local_318[0] = local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"");
        local_2d8 = local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
        __l_01._M_len = 0xc;
        __l_01._M_array = &local_3b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_a8 + 0x30),__l_01,(allocator_type *)&local_3d8);
        Table::add_record(&this->m_oracle_stats,(record *)(local_a8 + 0x30));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_a8 + 0x30));
        lVar11 = 0;
        do {
          if (local_248 + lVar11 != *(undefined1 **)((long)local_258 + lVar11)) {
            operator_delete(*(undefined1 **)((long)local_258 + lVar11));
          }
          lVar11 = lVar11 + -0x20;
        } while (lVar11 != -0x180);
        return 0;
      }
LAB_00131e29:
      __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                    0x2be,
                    "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
  }
  else {
    uVar12 = lVar11 >> 3;
    uVar16 = uVar12 + (uVar12 == 0);
    if (*puVar2 == 0) {
      uVar20 = 0;
      do {
        uVar22 = uVar16;
        if (uVar16 - 1 == uVar20) break;
        uVar22 = uVar20 + 1;
        lVar11 = uVar20 + 1;
        uVar20 = uVar22;
      } while (puVar2[lVar11] == 0);
      bVar26 = uVar22 < uVar12;
      goto LAB_0012ffaa;
    }
  }
  local_3f8.
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(x);
  local_3b8.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::vector(&local_420,sVar13,(value_type *)&local_3b8,(allocator_type *)&local_3d8);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_3b8);
  local_3b8._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1f8,(long)this->m_num_vertices,(value_type_conflict1 *)&local_3b8,
             (allocator_type *)&local_3d8);
  sVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from(x,0)
  ;
  uVar17 = 0;
  for (; sVar13 != 0xffffffffffffffff;
      sVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                         (x,sVar13)) {
    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[sVar13] = uVar17;
    uVar17 = uVar17 + 1;
  }
  pdVar24 = (this->m_edges).
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pdVar18 = (this->m_edges).
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_400 = x;
  if (pdVar24 != pdVar18) {
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,
                 &pdVar24->m_bits);
      local_3b8.field_2._8_8_ = pdVar24->m_num_bits;
      boost::operator&(&local_3d8,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,
                       local_400);
      lVar11 = (long)local_3d8.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_3d8.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      bVar26 = lVar11 != 0;
      if (lVar11 == 0) {
LAB_001300f9:
        if (bVar26) goto LAB_001300fd;
        boost::operator-(&local_228,
                         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8
                         ,y);
        std::
        vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                  ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                    *)&local_3f8,&local_228);
        bVar26 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                 m_check_invariants(&local_228);
        if (!bVar26) goto LAB_00131e29;
LAB_00130193:
        if (local_228.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        uVar12 = lVar11 >> 3;
        uVar16 = uVar12 + (uVar12 == 0);
        if (*local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start == 0) {
          uVar20 = 0;
          do {
            uVar22 = uVar16;
            if (uVar16 - 1 == uVar20) break;
            uVar22 = uVar20 + 1;
            lVar11 = uVar20 + 1;
            uVar20 = uVar22;
          } while (local_3d8.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11] == 0);
          bVar26 = uVar22 < uVar12;
          goto LAB_001300f9;
        }
LAB_001300fd:
        sVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                           (&local_3d8);
        if (sVar13 == 1) {
          sVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                   m_do_find_from(&local_3d8,0);
          pvVar3 = local_420.
                   super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[sVar14];
          boost::operator-(&local_228,
                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &local_3b8,y);
          std::
          vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
          ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                    ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                      *)(pvVar3 + uVar17),&local_228);
          bVar26 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                   m_check_invariants(&local_228);
          if (bVar26) goto LAB_00130193;
          goto LAB_00131e29;
        }
      }
      bVar26 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
               m_check_invariants(&local_3d8);
      if (!bVar26) goto LAB_00131e29;
      if (local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d8.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar26 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
               m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_3b8);
      if (!bVar26) goto LAB_00131e29;
      if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_3b8._M_dataplus._M_p);
      }
      pdVar24 = pdVar24 + 1;
    } while (pdVar24 != pdVar18);
  }
  pvVar3 = local_420.
           super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_420.
      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_420.
      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __x = local_420.
          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&local_3d8,__x);
      if (local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start ==
          local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        if ((this->m_configuration).collect_oracle_statistics != true) goto LAB_00131555;
        tVar15.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_(&local_3b8,local_400);
        edge_to_string_abi_cxx11_(&local_398,y);
        local_378[0] = local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"10","");
        ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar15);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
        local_318[0] = local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"");
        local_2d8 = local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"0","");
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"0","");
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"0","");
        uVar12 = (long)local_3f8.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_3f8.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        cVar19 = '\x01';
        if (uVar12 < 10) goto LAB_001313eb;
        uVar16 = uVar12;
        cVar5 = '\x04';
        goto LAB_00131017;
      }
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&local_3d8);
      __x = __x + 1;
    } while (__x != pvVar3);
  }
  bVar26 = (this->m_configuration).collect_oracle_statistics;
  if (local_3f8.
      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_3f8.
      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_438 = 2;
    if (bVar26 != false) {
      tVar15.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      edge_to_string_abi_cxx11_(&local_3b8,local_400);
      edge_to_string_abi_cxx11_(&local_398,y);
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"11","");
      ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar15);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
      pHVar21 = (Hypergraph *)(local_108 + 0x30);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar21,&local_420);
      uVar9 = maximum_iteration_count
                        (pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(local_108 + 0x30));
      uVar1 = -uVar9;
      if (0 < (int)uVar9) {
        uVar1 = uVar9;
      }
      uVar25 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_00131574;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_00131574;
          }
          if (uVar8 < 10000) goto LAB_00131574;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_00131574:
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct((ulong)local_2f8,(char)uVar25 - (char)((int)uVar9 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_2f8[0] + (uVar9 >> 0x1f),uVar25,uVar1);
      uVar12 = ((long)local_420.
                      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_420.
                      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      cVar19 = '\x01';
      if (9 < uVar12) {
        uVar16 = uVar12;
        cVar5 = '\x04';
        do {
          cVar19 = cVar5;
          if (uVar16 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00131625;
          }
          if (uVar16 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00131625;
          }
          if (uVar16 < 10000) goto LAB_00131625;
          bVar26 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar5 = cVar19 + '\x04';
        } while (bVar26);
        cVar19 = cVar19 + '\x01';
      }
LAB_00131625:
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_2d8,local_2d0,uVar12);
      pHVar21 = (Hypergraph *)(local_108 + 0x18);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar21,&local_420);
      uVar9 = summed_sx_sizes(pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                       *)(local_108 + 0x18));
      uVar1 = -uVar9;
      if (0 < (int)uVar9) {
        uVar1 = uVar9;
      }
      uVar25 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_001316d4;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_001316d4;
          }
          if (uVar8 < 10000) goto LAB_001316d4;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_001316d4:
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct((ulong)local_2b8,(char)uVar25 - (char)((int)uVar9 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_2b8[0] + (uVar9 >> 0x1f),uVar25,uVar1);
      pHVar21 = (Hypergraph *)local_108;
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar21,&local_420);
      uVar9 = total_number_of_vertices_in_s
                        (pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)local_108);
      uVar1 = -uVar9;
      if (0 < (int)uVar9) {
        uVar1 = uVar9;
      }
      uVar25 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_0013178c;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_0013178c;
          }
          if (uVar8 < 10000) goto LAB_0013178c;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_0013178c:
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct((ulong)local_298,(char)uVar25 - (char)((int)uVar9 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_298[0] + (uVar9 >> 0x1f),uVar25,uVar1);
      local_278 = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"0","");
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"0","");
      __l_03._M_len = 0xc;
      __l_03._M_array = &local_3b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c0,__l_03,(allocator_type *)&local_3d8);
      Table::add_record(&this->m_oracle_stats,&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      lVar11 = 0;
      do {
        if (local_248 + lVar11 != *(undefined1 **)((long)local_258 + lVar11)) {
          operator_delete(*(undefined1 **)((long)local_258 + lVar11));
        }
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != -0x180);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)local_108);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)(local_108 + 0x18));
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)(local_108 + 0x30));
    }
  }
  else {
    if (bVar26 != false) {
      this->m_iteration_count = 0;
      rVar10 = std::chrono::_V2::system_clock::now();
      (this->m_oracle_bf_timestamp).__d.__r = rVar10;
    }
    sVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(local_400);
    local_3b8._M_dataplus._M_p = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_228.m_bits,sVar13,(value_type_conflict1 *)&local_3b8,
               (allocator_type *)&local_3d8);
    local_208 = &this->m_oracle_stats;
    local_200 = local_318;
    local_230 = local_258;
    local_438 = 0;
    do {
      if ((this->m_configuration).collect_oracle_statistics == true) {
        this->m_iteration_count = this->m_iteration_count + 1;
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_3d8,(long)this->m_num_vertices,0,(allocator<unsigned_long> *)&local_3b8);
      if (local_420.
          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_420.
          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar23 = 10;
      }
      else {
        bVar26 = true;
        lVar11 = 0;
        uVar12 = 0;
        do {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
                    (&local_3d8,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (local_228.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12] * 0x20 +
                     *(long *)((long)&((local_420.
                                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar11)));
          if (bVar26) {
            uVar17 = local_228.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12];
            local_228.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12] = uVar17 + 1;
            if (uVar17 + 1 ==
                *(long *)((long)&((local_420.
                                   super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar11) -
                *(long *)((long)&((local_420.
                                   super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar11) >> 5) {
              local_228.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar12] = 0;
            }
            else {
              bVar26 = false;
            }
          }
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 0x18;
        } while (uVar12 < (ulong)(((long)local_420.
                                         super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_420.
                                         super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
        iVar23 = 0;
        if (bVar26) {
          iVar23 = 10;
        }
      }
      pdVar24 = local_3f8.
                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_3f8.
          super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_3f8.
          super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00130431:
        iVar23 = 1;
        local_438 = 1;
        if ((this->m_configuration).collect_oracle_statistics == true) {
          tVar15.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          edge_to_string_abi_cxx11_(&local_3b8,local_400);
          edge_to_string_abi_cxx11_(&local_398,y);
          local_378[0] = local_368;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"14","");
          ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar15);
          ns_string_abi_cxx11_(&local_338,(time_point)(this->m_oracle_bf_timestamp).__d.__r,tVar15);
          uVar1 = this->m_iteration_count;
          uVar9 = -uVar1;
          if (0 < (int)uVar1) {
            uVar9 = uVar1;
          }
          uVar25 = 1;
          if (9 < uVar9) {
            uVar12 = (ulong)uVar9;
            uVar4 = 4;
            do {
              uVar25 = uVar4;
              uVar8 = (uint)uVar12;
              if (uVar8 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_0013054c;
              }
              if (uVar8 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_0013054c;
              }
              if (uVar8 < 10000) goto LAB_0013054c;
              uVar12 = uVar12 / 10000;
              uVar4 = uVar25 + 4;
            } while (99999 < uVar8);
            uVar25 = uVar25 + 1;
          }
LAB_0013054c:
          local_318[0] = local_308;
          std::__cxx11::string::_M_construct
                    ((ulong)local_200,(char)uVar25 - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_318[0] + (uVar1 >> 0x1f),uVar25,uVar9);
          pHVar21 = (Hypergraph *)(local_138 + 0x18);
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)pHVar21,&local_420);
          uVar9 = maximum_iteration_count
                            (pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                      *)(local_138 + 0x18));
          uVar1 = -uVar9;
          if (0 < (int)uVar9) {
            uVar1 = uVar9;
          }
          uVar25 = 1;
          if (9 < uVar1) {
            uVar12 = (ulong)uVar1;
            uVar4 = 4;
            do {
              uVar25 = uVar4;
              uVar8 = (uint)uVar12;
              if (uVar8 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_00130611;
              }
              if (uVar8 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_00130611;
              }
              if (uVar8 < 10000) goto LAB_00130611;
              uVar12 = uVar12 / 10000;
              uVar4 = uVar25 + 4;
            } while (99999 < uVar8);
            uVar25 = uVar25 + 1;
          }
LAB_00130611:
          local_2f8[0] = local_2e8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_2f8,(char)uVar25 - (char)((int)uVar9 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_2f8[0] + (uVar9 >> 0x1f),uVar25,uVar1);
          uVar12 = ((long)local_420.
                          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_420.
                          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          cVar19 = '\x01';
          if (9 < uVar12) {
            uVar16 = uVar12;
            cVar5 = '\x04';
            do {
              cVar19 = cVar5;
              if (uVar16 < 100) {
                cVar19 = cVar19 + -2;
                goto LAB_001306c8;
              }
              if (uVar16 < 1000) {
                cVar19 = cVar19 + -1;
                goto LAB_001306c8;
              }
              if (uVar16 < 10000) goto LAB_001306c8;
              bVar26 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              cVar5 = cVar19 + '\x04';
            } while (bVar26);
            cVar19 = cVar19 + '\x01';
          }
LAB_001306c8:
          local_2d8 = local_2c8;
          std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar19);
          std::__detail::__to_chars_10_impl<unsigned_long>(local_2d8,local_2d0,uVar12);
          pHVar21 = (Hypergraph *)local_138;
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)pHVar21,&local_420);
          uVar9 = summed_sx_sizes(pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           *)local_138);
          uVar1 = -uVar9;
          if (0 < (int)uVar9) {
            uVar1 = uVar9;
          }
          uVar25 = 1;
          if (9 < uVar1) {
            uVar12 = (ulong)uVar1;
            uVar4 = 4;
            do {
              uVar25 = uVar4;
              uVar8 = (uint)uVar12;
              if (uVar8 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_00130787;
              }
              if (uVar8 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_00130787;
              }
              if (uVar8 < 10000) goto LAB_00130787;
              uVar12 = uVar12 / 10000;
              uVar4 = uVar25 + 4;
            } while (99999 < uVar8);
            uVar25 = uVar25 + 1;
          }
LAB_00130787:
          local_2b8[0] = local_2a8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_2b8,(char)uVar25 - (char)((int)uVar9 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_2b8[0] + (uVar9 >> 0x1f),uVar25,uVar1);
          pHVar21 = (Hypergraph *)(local_168 + 0x18);
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)pHVar21,&local_420);
          uVar9 = total_number_of_vertices_in_s
                            (pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                      *)(local_168 + 0x18));
          uVar1 = -uVar9;
          if (0 < (int)uVar9) {
            uVar1 = uVar9;
          }
          uVar25 = 1;
          if (9 < uVar1) {
            uVar12 = (ulong)uVar1;
            uVar4 = 4;
            do {
              uVar25 = uVar4;
              uVar8 = (uint)uVar12;
              if (uVar8 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_0013084d;
              }
              if (uVar8 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_0013084d;
              }
              if (uVar8 < 10000) goto LAB_0013084d;
              uVar12 = uVar12 / 10000;
              uVar4 = uVar25 + 4;
            } while (99999 < uVar8);
            uVar25 = uVar25 + 1;
          }
LAB_0013084d:
          local_298[0] = local_288;
          std::__cxx11::string::_M_construct
                    ((ulong)local_298,(char)uVar25 - (char)((int)uVar9 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_298[0] + (uVar9 >> 0x1f),uVar25,uVar1);
          uVar12 = (long)local_3f8.
                         super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3f8.
                         super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          cVar19 = '\x01';
          if (9 < uVar12) {
            uVar16 = uVar12;
            cVar5 = '\x04';
            do {
              cVar19 = cVar5;
              if (uVar16 < 100) {
                cVar19 = cVar19 + -2;
                goto LAB_001308f6;
              }
              if (uVar16 < 1000) {
                cVar19 = cVar19 + -1;
                goto LAB_001308f6;
              }
              if (uVar16 < 10000) goto LAB_001308f6;
              bVar26 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              cVar5 = cVar19 + '\x04';
            } while (bVar26);
            cVar19 = cVar19 + '\x01';
          }
LAB_001308f6:
          local_278 = local_268;
          std::__cxx11::string::_M_construct((ulong)&local_278,cVar19);
          std::__detail::__to_chars_10_impl<unsigned_long>(local_278,local_270,uVar12);
          pHVar21 = (Hypergraph *)local_168;
          std::
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)pHVar21,&local_3f8);
          uVar9 = total_number_of_vertices_in_t(pHVar21,(edge_vec *)local_168);
          uVar1 = -uVar9;
          if (0 < (int)uVar9) {
            uVar1 = uVar9;
          }
          uVar25 = 1;
          if (9 < uVar1) {
            uVar12 = (ulong)uVar1;
            uVar4 = 4;
            do {
              uVar25 = uVar4;
              uVar8 = (uint)uVar12;
              if (uVar8 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_001309a8;
              }
              if (uVar8 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_001309a8;
              }
              if (uVar8 < 10000) goto LAB_001309a8;
              uVar12 = uVar12 / 10000;
              uVar4 = uVar25 + 4;
            } while (99999 < uVar8);
            uVar25 = uVar25 + 1;
          }
LAB_001309a8:
          local_258[0] = local_248;
          std::__cxx11::string::_M_construct
                    ((ulong)local_258,(char)uVar25 - (char)((int)uVar9 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_258[0] + (uVar9 >> 0x1f),uVar25,uVar1);
          __l._M_len = 0xc;
          __l._M_array = &local_3b8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,__l,&local_401);
          Table::add_record(local_208,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          lVar11 = 0;
          do {
            if (local_248 + lVar11 != *(undefined1 **)((long)local_258 + lVar11)) {
              operator_delete(*(undefined1 **)((long)local_258 + lVar11));
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x180);
          std::
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)local_168);
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)(local_168 + 0x18));
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)local_138);
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)(local_138 + 0x18));
          iVar23 = 1;
          local_438 = 1;
        }
      }
      else {
        bVar26 = true;
        pdVar18 = local_3f8.
                  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,
                     &pdVar18->m_bits);
          local_3b8.field_2._8_8_ = pdVar18->m_num_bits;
          bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &local_3b8,&local_3d8);
          if (bVar6) {
            bVar26 = false;
          }
          bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)&local_3b8);
          if (!bVar7) goto LAB_00131e29;
          if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_3b8._M_dataplus._M_p);
          }
          pdVar18 = pdVar18 + 1;
        } while (!bVar6 && pdVar18 != pdVar24);
        if (bVar26) goto LAB_00130431;
      }
      bVar26 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
               m_check_invariants(&local_3d8);
      if (!bVar26) goto LAB_00131e29;
      if (local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d8.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (iVar23 == 0);
    if ((iVar23 == 10) && (local_438 = 0, (this->m_configuration).collect_oracle_statistics == true)
       ) {
      tVar15.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      edge_to_string_abi_cxx11_(&local_3b8,local_400);
      edge_to_string_abi_cxx11_(&local_398,y);
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"15","");
      ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar15);
      ns_string_abi_cxx11_(&local_338,(time_point)(this->m_oracle_bf_timestamp).__d.__r,tVar15);
      uVar1 = this->m_iteration_count;
      uVar9 = -uVar1;
      if (0 < (int)uVar1) {
        uVar9 = uVar1;
      }
      uVar25 = 1;
      if (9 < uVar9) {
        uVar12 = (ulong)uVar9;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_001318b9;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_001318b9;
          }
          if (uVar8 < 10000) goto LAB_001318b9;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_001318b9:
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct((ulong)local_318,(char)uVar25 - (char)((int)uVar1 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_318[0] + (uVar1 >> 0x1f),uVar25,uVar9);
      pHVar21 = (Hypergraph *)(local_1b0 + 0x18);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar21,&local_420);
      uVar9 = maximum_iteration_count
                        (pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(local_1b0 + 0x18));
      uVar1 = -uVar9;
      if (0 < (int)uVar9) {
        uVar1 = uVar9;
      }
      uVar25 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_00131986;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_00131986;
          }
          if (uVar8 < 10000) goto LAB_00131986;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_00131986:
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct((ulong)local_2f8,(char)uVar25 - (char)((int)uVar9 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_2f8[0] + (uVar9 >> 0x1f),uVar25,uVar1);
      uVar12 = ((long)local_420.
                      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_420.
                      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      cVar19 = '\x01';
      if (9 < uVar12) {
        uVar16 = uVar12;
        cVar5 = '\x04';
        do {
          cVar19 = cVar5;
          if (uVar16 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00131a31;
          }
          if (uVar16 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00131a31;
          }
          if (uVar16 < 10000) goto LAB_00131a31;
          bVar26 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar5 = cVar19 + '\x04';
        } while (bVar26);
        cVar19 = cVar19 + '\x01';
      }
LAB_00131a31:
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_2d8,local_2d0,uVar12);
      pHVar21 = (Hypergraph *)local_1b0;
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar21,&local_420);
      uVar9 = summed_sx_sizes(pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                       *)local_1b0);
      uVar1 = -uVar9;
      if (0 < (int)uVar9) {
        uVar1 = uVar9;
      }
      uVar25 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_00131ae4;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_00131ae4;
          }
          if (uVar8 < 10000) goto LAB_00131ae4;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_00131ae4:
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct((ulong)local_2b8,(char)uVar25 - (char)((int)uVar9 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_2b8[0] + (uVar9 >> 0x1f),uVar25,uVar1);
      pHVar21 = (Hypergraph *)(local_1e0 + 0x18);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar21,&local_420);
      uVar9 = total_number_of_vertices_in_s
                        (pHVar21,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)(local_1e0 + 0x18));
      uVar1 = -uVar9;
      if (0 < (int)uVar9) {
        uVar1 = uVar9;
      }
      uVar25 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_00131ba0;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_00131ba0;
          }
          if (uVar8 < 10000) goto LAB_00131ba0;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_00131ba0:
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct((ulong)local_298,(char)uVar25 - (char)((int)uVar9 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_298[0] + (uVar9 >> 0x1f),uVar25,uVar1);
      uVar12 = (long)local_3f8.
                     super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3f8.
                     super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      cVar19 = '\x01';
      if (9 < uVar12) {
        uVar16 = uVar12;
        cVar5 = '\x04';
        do {
          cVar19 = cVar5;
          if (uVar16 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_00131c47;
          }
          if (uVar16 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_00131c47;
          }
          if (uVar16 < 10000) goto LAB_00131c47;
          bVar26 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar5 = cVar19 + '\x04';
        } while (bVar26);
        cVar19 = cVar19 + '\x01';
      }
LAB_00131c47:
      local_278 = local_268;
      std::__cxx11::string::_M_construct((ulong)&local_278,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_278,local_270,uVar12);
      pHVar21 = (Hypergraph *)local_1e0;
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)pHVar21,&local_3f8);
      uVar9 = total_number_of_vertices_in_t(pHVar21,(edge_vec *)local_1e0);
      uVar1 = -uVar9;
      if (0 < (int)uVar9) {
        uVar1 = uVar9;
      }
      uVar25 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar4 = 4;
        do {
          uVar25 = uVar4;
          uVar8 = (uint)uVar12;
          if (uVar8 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_00131cfa;
          }
          if (uVar8 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_00131cfa;
          }
          if (uVar8 < 10000) goto LAB_00131cfa;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar25 + 4;
        } while (99999 < uVar8);
        uVar25 = uVar25 + 1;
      }
LAB_00131cfa:
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct((ulong)local_258,(char)uVar25 - (char)((int)uVar9 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_258[0] + (uVar9 >> 0x1f),uVar25,uVar1);
      __l_04._M_len = 0xc;
      __l_04._M_array = &local_3b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_180,__l_04,(allocator_type *)&local_3d8);
      Table::add_record(&this->m_oracle_stats,&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_180);
      lVar11 = 0;
      do {
        if (local_248 + lVar11 != *(undefined1 **)((long)local_258 + lVar11)) {
          operator_delete(*(undefined1 **)((long)local_258 + lVar11));
        }
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != -0x180);
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)local_1e0);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)(local_1e0 + 0x18));
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)local_1b0);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)(local_1b0 + 0x18));
      local_438 = 0;
    }
    if (local_228.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
LAB_00131dee:
  if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&local_420);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_3f8);
  return local_438;
  while( true ) {
    if (uVar16 < 10000) goto LAB_001313eb;
    bVar26 = uVar16 < 100000;
    uVar16 = uVar16 / 10000;
    cVar5 = cVar19 + '\x04';
    if (bVar26) break;
LAB_00131017:
    cVar19 = cVar5;
    if (uVar16 < 100) {
      cVar19 = cVar19 + -2;
      goto LAB_001313eb;
    }
    if (uVar16 < 1000) {
      cVar19 = cVar19 + -1;
      goto LAB_001313eb;
    }
  }
  cVar19 = cVar19 + '\x01';
LAB_001313eb:
  local_278 = local_268;
  std::__cxx11::string::_M_construct((ulong)&local_278,cVar19);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_278,local_270,uVar12);
  pHVar21 = (Hypergraph *)local_a8;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)pHVar21,&local_3f8);
  uVar9 = total_number_of_vertices_in_t(pHVar21,(edge_vec *)local_a8);
  uVar1 = -uVar9;
  if (0 < (int)uVar9) {
    uVar1 = uVar9;
  }
  uVar25 = 1;
  if (9 < uVar1) {
    uVar12 = (ulong)uVar1;
    uVar4 = 4;
    do {
      uVar25 = uVar4;
      uVar8 = (uint)uVar12;
      if (uVar8 < 100) {
        uVar25 = uVar25 - 2;
        goto LAB_0013149a;
      }
      if (uVar8 < 1000) {
        uVar25 = uVar25 - 1;
        goto LAB_0013149a;
      }
      if (uVar8 < 10000) goto LAB_0013149a;
      uVar12 = uVar12 / 10000;
      uVar4 = uVar25 + 4;
    } while (99999 < uVar8);
    uVar25 = uVar25 + 1;
  }
LAB_0013149a:
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct((ulong)local_258,(char)uVar25 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_258[0] + (uVar9 >> 0x1f),uVar25,uVar1);
  __l_02._M_len = 0xc;
  __l_02._M_array = &local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_a8 + 0x18),__l_02,(allocator_type *)&local_228);
  Table::add_record(&this->m_oracle_stats,(record *)(local_a8 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a8 + 0x18));
  lVar11 = 0;
  do {
    if (local_248 + lVar11 != *(undefined1 **)((long)local_258 + lVar11)) {
      operator_delete(*(undefined1 **)((long)local_258 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x180);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_a8);
LAB_00131555:
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_3d8);
  local_438 = 0;
  goto LAB_00131dee;
}

Assistant:

int Hypergraph::extendable(const edge &x, const edge &y) {
	if (m_configuration.collect_oracle_statistics) m_oracle_timestamp = Clock::now();
	// 2
	if (x.none()) {
		// 3
		if (is_hitting_set(~y)) {
			if (m_configuration.collect_oracle_statistics) {
				auto now = Clock::now();
				m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "3", ns_string(m_oracle_timestamp, now), "", "", "", "", "", "", "", "" });
			}
			return EXTENDABLE;
		}
		// 4
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "4", ns_string(m_oracle_timestamp, now), "", "", "", "", "", "", "", "" });
		}
		return NOT_EXTENDABLE;
	}
	// 5
	edge_vec t;
	// 6
	std::vector<edge_vec> s(x.count(), edge_vec());
	std::vector<std::vector<edge_vec>::size_type> x_index_to_s_index(m_num_vertices, -1);
	std::vector<edge_vec>::size_type s_index = -1;
	for (auto x_index = x.find_first(); x_index != edge::npos; x_index = x.find_next(x_index)) x_index_to_s_index[x_index] = ++s_index;
	// 7
	for (edge e : m_edges) {
		edge intersection = e & x;
		// 9
		if (intersection.none()) {
			t.push_back(e - y);
			continue;
		}
		// 8
		if (intersection.count() == 1) s[x_index_to_s_index[intersection.find_first()]].push_back(e - y);
	}
	// 10
	for (auto sx : s) if (sx.empty()) {
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "10", ns_string(m_oracle_timestamp, now), "", "", "", "0", "0", "0", std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
		}
		return NOT_EXTENDABLE;
	}
	// 11
	if (t.empty()) {
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "11", ns_string(m_oracle_timestamp, now), "", "", std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), "0", "0" });
		}
		return MINIMAL;
	}
	// 12
	if (m_configuration.collect_oracle_statistics) {
		m_iteration_count = 0;
		m_oracle_bf_timestamp = Clock::now();
	}
	std::vector<edge::size_type> iteration_position(x.count(), 0);
	while (true) {
		if (m_configuration.collect_oracle_statistics) m_iteration_count++;
		// 13
		edge w(m_num_vertices);
		bool increase_next = true;
		for (std::vector<edge_vec>::size_type i_s = 0; i_s < s.size(); ++i_s) {
			w |= s[i_s][iteration_position[i_s]];
			if (increase_next) {
				++iteration_position[i_s];
				if (iteration_position[i_s] == s[i_s].size()) iteration_position[i_s] = 0;
				else increase_next = false;
			}
		}
		// 14
		bool all_no_subset = true;
		for (edge e : t) {
			if (e.is_subset_of(w)) {
				all_no_subset = false;
				break;
			}
		}
		if (all_no_subset) {
			if (m_configuration.collect_oracle_statistics) {
				auto now = Clock::now();
				m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "14", ns_string(m_oracle_timestamp, now), ns_string(m_oracle_bf_timestamp, now), std::to_string(m_iteration_count), std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
			}
			return EXTENDABLE;
		}
		if (increase_next) break;
	}
	// 15
	if (m_configuration.collect_oracle_statistics) {
		auto now = Clock::now();
		m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "15", ns_string(m_oracle_timestamp, now), ns_string(m_oracle_bf_timestamp, now), std::to_string(m_iteration_count), std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
	}
	return NOT_EXTENDABLE;
}